

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Block * __thiscall wasm::Builder::makeBlock(Builder *this,Expression *first)

{
  Block *pBVar1;
  
  pBVar1 = MixedArena::alloc<wasm::Block>(&this->wasm->allocator);
  if (first != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar1->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,first);
    ::wasm::Block::finalize(pBVar1);
  }
  return pBVar1;
}

Assistant:

Block* makeBlock(Expression* first = nullptr) {
    auto* ret = wasm.allocator.alloc<Block>();
    if (first) {
      ret->list.push_back(first);
      ret->finalize();
    }
    return ret;
  }